

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O0

void __thiscall
BiquadFilter::SetupPeaking(BiquadFilter *this,float cutoff,float samplerate,float gain,float Q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float inv_a0;
  float a0;
  float alpha;
  float A;
  float w0;
  float Q_local;
  float gain_local;
  float samplerate_local;
  float cutoff_local;
  BiquadFilter *this_local;
  
  fVar1 = (cutoff * 6.2831855) / samplerate;
  fVar2 = powf(10.0,gain * 0.025);
  fVar3 = sinf(fVar1);
  fVar3 = fVar3 / (Q * 2.0);
  this->b0 = fVar3 * fVar2 + 1.0;
  fVar4 = cosf(fVar1);
  this->b1 = fVar4 * -2.0;
  this->b2 = -fVar3 * fVar2 + 1.0;
  fVar1 = cosf(fVar1);
  this->a1 = fVar1 * -2.0;
  this->a2 = 1.0 - fVar3 / fVar2;
  fVar1 = 1.0 / (fVar3 / fVar2 + 1.0);
  this->a1 = fVar1 * this->a1;
  this->a2 = fVar1 * this->a2;
  this->b0 = fVar1 * this->b0;
  this->b1 = fVar1 * this->b1;
  this->b2 = fVar1 * this->b2;
  return;
}

Assistant:

void BiquadFilter::SetupPeaking(float cutoff, float samplerate, float gain, float Q)
{
    float w0 = 2.0f * kPI * cutoff / samplerate, A = powf(10.0f, gain * 0.025f), alpha = sinf(w0) / (2.0f * Q), a0;
    b0 = 1.0f + alpha * A;
    b1 = -2.0f * cosf(w0);
    b2 = 1.0f - alpha * A;
    a0 = 1.0f + alpha / A;
    a1 = -2.0f * cosf(w0);
    a2 = 1.0f - alpha / A;
    float inv_a0 = 1.0f / a0; a1 *= inv_a0; a2 *= inv_a0; b0 *= inv_a0; b1 *= inv_a0; b2 *= inv_a0;
}